

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O1

Iso_Sto_t * Iso_StoStart(Aig_Man_t *pAig)

{
  int iVar1;
  Iso_Sto_t *pIVar2;
  Iso_Dat_t *pIVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  
  pIVar2 = (Iso_Sto_t *)calloc(1,0x38);
  pIVar2->pAig = pAig;
  iVar1 = pAig->vObjs->nSize;
  pIVar2->nObjs = iVar1;
  pIVar3 = (Iso_Dat_t *)calloc((long)iVar1,4);
  pIVar2->pData = pIVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = 1000;
  memset(piVar5,0,4000);
  pIVar2->vVisited = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = 1000;
  memset(piVar5,0,4000);
  pIVar2->vPlaces = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  __s = (void **)malloc(8000);
  pVVar6->pArray = __s;
  pVVar6->nSize = 1000;
  memset(__s,0,8000);
  pIVar2->vRoots = pVVar6;
  piVar5 = (int *)calloc(0x10000,4);
  pIVar2->pCounters = piVar5;
  return pIVar2;
}

Assistant:

Iso_Sto_t * Iso_StoStart( Aig_Man_t * pAig )
{
    Iso_Sto_t * p;
    p = ABC_CALLOC( Iso_Sto_t, 1 );
    p->pAig      = pAig;
    p->nObjs     = Aig_ManObjNumMax( pAig );
    p->pData     = ABC_CALLOC( Iso_Dat_t, p->nObjs );
    p->vVisited  = Vec_IntStart( 1000 );
    p->vPlaces   = Vec_IntStart( 1000 );
    p->vRoots    = Vec_PtrStart( 1000 );
    p->pCounters = ABC_CALLOC( int, (1 << AIG_ISO_NUM) );
    return p;
}